

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

int __thiscall ON_ClippingRegion::IsVisible(ON_ClippingRegion *this,int count,ON_3dPoint *p)

{
  double dVar1;
  double dVar2;
  double *cv;
  int iVar3;
  uint uVar4;
  int i;
  uint uVar5;
  double *xform;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (count == 0) {
    return 0;
  }
  uVar6 = 0xffffffff;
  uVar7 = 0;
  while( true ) {
    uVar5 = 0;
    if (this->m_clip_plane_count != 0) {
      uVar5 = 0;
      uVar8 = 0x40;
      pdVar9 = (double *)&this->field_0x110;
      iVar3 = this->m_clip_plane_count;
      do {
        uVar4 = uVar8;
        if (-this->m_clip_plane_tolerance <=
            pdVar9[2] * p->z + *pdVar9 * p->x + pdVar9[1] * p->y + pdVar9[3]) {
          uVar4 = 0;
        }
        uVar5 = uVar5 | uVar4;
        uVar8 = uVar8 * 2;
        pdVar9 = pdVar9 + 4;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    dVar10 = p->x;
    dVar1 = p->y;
    dVar2 = p->z;
    dVar11 = (this->m_xform).m_xform[3][2] * dVar2 +
             (this->m_xform).m_xform[3][0] * dVar10 + (this->m_xform).m_xform[3][1] * dVar1 +
             (this->m_xform).m_xform[3][3];
    dVar13 = (this->m_xform).m_xform[0][2] * dVar2 +
             (this->m_xform).m_xform[0][0] * dVar10 + dVar1 * (this->m_xform).m_xform[0][1] +
             (this->m_xform).m_xform[0][3];
    dVar12 = -dVar11;
    if (dVar12 <= dVar13) {
      if (dVar11 < dVar13) {
        uVar5 = uVar5 | 2;
      }
    }
    else {
      uVar5 = uVar5 | 1;
    }
    dVar13 = (this->m_xform).m_xform[1][2] * dVar2 +
             (this->m_xform).m_xform[1][0] * dVar10 + dVar1 * (this->m_xform).m_xform[1][1] +
             (this->m_xform).m_xform[1][3];
    if (dVar12 <= dVar13) {
      if (dVar11 < dVar13) {
        uVar5 = uVar5 | 8;
      }
    }
    else {
      uVar5 = uVar5 | 4;
    }
    dVar10 = dVar2 * (this->m_xform).m_xform[2][2] +
             dVar10 * (this->m_xform).m_xform[2][0] + dVar1 * (this->m_xform).m_xform[2][1] +
             (this->m_xform).m_xform[2][3];
    if (dVar12 <= dVar10) {
      if (dVar11 < dVar10) {
        uVar5 = uVar5 | 0x20;
      }
    }
    else {
      uVar5 = uVar5 | 0x10;
    }
    uVar7 = uVar7 | uVar5;
    uVar6 = uVar6 & uVar5;
    if (uVar6 == 0 && uVar7 != 0) break;
    count = count + -1;
    p = p + 1;
    if (count == 0) {
LAB_003e042a:
      iVar3 = (uVar7 == 0) + 1;
      if (uVar6 != 0) {
        iVar3 = 0;
      }
      return iVar3;
    }
  }
  uVar6 = 0;
  goto LAB_003e042a;
}

Assistant:

int ON_ClippingRegion::IsVisible( int count, const ON_3dPoint* p ) const
{
  const double* xform;
  const ON_PlaneEquation* cpeqn;
  const double* cv;
  double x, w;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;

  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  for ( i = count; i--; cv += 3 )
  {
    out = 0;
    if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d;
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3];
    if (x < -w) out |= 0x01; else if (x > w) out |= 0x02;
    x = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7];
    if (x < -w) out |= 0x04; else if (x > w) out |= 0x08;
    x = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11];
    if (x < -w) out |= 0x10; else if (x > w) out |= 0x20;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}